

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

void __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::run
          (PolarExtentCoreSimd<xsimd::avx512bw> *this,PolarExtentCoreContext *ctx)

{
  ulong *in_RSI;
  float fVar1;
  simd_register<float,_xsimd::avx512f> in_ZMM0;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  register_type afVar4;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *in_stack_00000020;
  PolarExtentCoreContext *in_stack_00000028;
  PolarExtentCoreSimd<xsimd::avx512bw> *in_stack_00000030;
  batch gain_1;
  size_t speaker_idx_2;
  extent_float_t *result_ptr;
  batch gain;
  size_t speaker_idx_1;
  size_t batch_i;
  bool all_ones;
  bool all_zeros;
  batch weight;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> pos;
  size_t i;
  size_t speaker_idx;
  float *in_stack_fffffffffffffab0;
  batch<float,_xsimd::avx512bw> local_540;
  simd_register<float,_xsimd::avx512f> in_stack_fffffffffffffb00;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *in_stack_fffffffffffffb60;
  PolarExtentCoreContext *in_stack_fffffffffffffb68;
  PolarExtentCoreSimd<xsimd::avx512bw> *in_stack_fffffffffffffb70;
  ulong local_488;
  batch<float,_xsimd::avx512bw> local_440;
  float *local_3c8;
  simd_register<float,_xsimd::avx512f> local_3c0;
  ulong local_350;
  ulong local_348;
  batch<float,_xsimd::avx512bw> local_340;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_2c4;
  undefined1 local_2c1;
  batch<float,_xsimd::avx512bw> local_2c0;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_244;
  byte local_241;
  simd_register<float,_xsimd::avx512f> local_240;
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  register_type local_180;
  undefined1 local_140 [64];
  undefined1 auStack_100 [64];
  undefined1 auStack_c0 [80];
  ulong local_70;
  ulong local_68;
  ulong *local_60;
  
  for (local_68 = 0; local_68 < in_RSI[1]; local_68 = local_68 + 1) {
    in_ZMM0.data = (register_type)ZEXT1664(ZEXT816(0) << 0x40);
    *(undefined4 *)(in_RSI[0x12] + local_68 * 4) = 0;
  }
  local_60 = in_RSI;
  for (local_70 = 0; local_70 < *local_60; local_70 = local_70 + 0x10) {
    xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>(in_stack_fffffffffffffab0);
    auVar2 = ZEXT1664(in_ZMM0.data._0_16_);
    local_180 = in_ZMM0.data;
    memcpy(local_140,local_180,0x40);
    xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>(in_stack_fffffffffffffab0);
    auVar3 = ZEXT1664(auVar2._0_16_);
    local_1c0 = auVar2;
    memcpy(auStack_100,local_1c0,0x40);
    xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>(in_stack_fffffffffffffab0);
    afVar4 = (register_type)ZEXT1664(auVar3._0_16_);
    local_200 = auVar3;
    memcpy(auStack_c0,local_200,0x40);
    if ((local_60[8] & 1) == 0) {
      weight_stadium(in_stack_00000030,in_stack_00000028,in_stack_00000020);
      local_240.data = afVar4;
    }
    else {
      weight_circle(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      local_240.data = afVar4;
    }
    xsimd::batch<float,_xsimd::avx512bw>::batch
              (in_stack_fffffffffffffb00.data._32_8_,in_stack_fffffffffffffb00.data[7]);
    local_244.data =
         (register_type)xsimd::operator==((batch<float,_xsimd::avx512bw> *)&local_240,&local_2c0);
    local_241 = xsimd::all<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)&local_244);
    in_ZMM0.data = (register_type)ZEXT464(0x3f800000);
    xsimd::batch<float,_xsimd::avx512bw>::batch
              (in_stack_fffffffffffffb00.data._32_8_,in_stack_fffffffffffffb00.data[7]);
    local_2c4.data =
         (register_type)xsimd::operator==((batch<float,_xsimd::avx512bw> *)&local_240,&local_340);
    local_2c1 = xsimd::all<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)&local_2c4);
    if ((bool)local_2c1) {
      local_348 = local_70 >> 4;
      for (local_350 = 0; local_350 < local_60[1]; local_350 = local_350 + 0x10) {
        xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>(in_stack_fffffffffffffab0);
        in_stack_fffffffffffffab0 = (float *)(local_60[0x12] + local_350 * 4);
        local_3c8 = in_stack_fffffffffffffab0;
        local_3c0.data = in_ZMM0.data;
        xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>(in_stack_fffffffffffffab0);
        xsimd::operator+(in_stack_fffffffffffffb00.data._48_8_,in_stack_fffffffffffffb00.data._40_8_
                        );
        afVar4 = (register_type)ZEXT1664(in_ZMM0.data._0_16_);
        local_440.super_simd_register<float,_xsimd::avx512bw>.
        super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
        super_simd_register<float,_xsimd::avx512f>.data =
             (simd_register<float,_xsimd::avx512bw>)
             (simd_register<float,_xsimd::avx512bw>)in_ZMM0.data;
        xsimd::store_aligned<xsimd::avx512bw,float>(in_stack_fffffffffffffab0,&local_440);
        in_ZMM0.data = afVar4;
      }
    }
    else if ((local_241 & 1) == 0) {
      for (local_488 = 0; local_488 < local_60[2]; local_488 = local_488 + 1) {
        xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>(in_stack_fffffffffffffab0);
        in_stack_fffffffffffffb00.data = in_ZMM0.data;
        xsimd::operator*(in_ZMM0.data._48_8_,in_ZMM0.data._40_8_);
        local_540.super_simd_register<float,_xsimd::avx512bw>.
        super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
        super_simd_register<float,_xsimd::avx512f>.data =
             (simd_register<float,_xsimd::avx512bw>)
             (simd_register<float,_xsimd::avx512bw>)in_ZMM0.data;
        fVar1 = xsimd::reduce_add<float,xsimd::avx512bw>(&local_540);
        fVar1 = fVar1 + *(float *)(local_60[0x12] + local_488 * 4);
        in_ZMM0.data = (register_type)ZEXT464((uint)fVar1);
        *(float *)(local_60[0x12] + local_488 * 4) = fVar1;
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }